

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O1

void zsummer::log4z::ParseConfig
               (char *file,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
               *outInfo)

{
  size_type sVar1;
  _Alloc_hider _Var2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  iterator iVar5;
  ostream *poVar6;
  long *plVar7;
  long lVar8;
  size_type sVar9;
  int iVar10;
  string line;
  string value;
  string curLoggerName;
  string key;
  string tmpstr;
  LoggerInfo li;
  string local_3e0;
  string local_3c0;
  key_type local_3a0;
  string local_380;
  _Base_ptr local_360;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>
  local_358;
  LoggerInfo local_2b0;
  char local_228 [504];
  
  __stream = fopen(file,"r");
  if (__stream != (FILE *)0x0) {
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    iVar10 = 0;
    local_3a0._M_string_length = 0;
    local_3a0.field_2._M_local_buf[0] = '\0';
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    local_3e0._M_string_length = 0;
    local_3e0.field_2._M_local_buf[0] = '\0';
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    local_380._M_string_length = 0;
    local_380.field_2._M_local_buf[0] = '\0';
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    local_3c0._M_string_length = 0;
    local_3c0.field_2._M_local_buf[0] = '\0';
    memset(local_228,0,500);
    pcVar4 = fgets(local_228,499,__stream);
    if (pcVar4 != (char *)0x0) {
      local_360 = &(outInfo->_M_t)._M_impl.super__Rb_tree_header._M_header;
      do {
        sVar1 = local_3e0._M_string_length;
        strlen(local_228);
        std::__cxx11::string::_M_replace((ulong)&local_3e0,0,(char *)sVar1,(ulong)local_228);
        TrimLogConfig(&local_3e0,'\0');
        iVar10 = iVar10 + 1;
        if (((char *)local_3e0._M_string_length != (char *)0x0) &&
           (*local_3e0._M_dataplus._M_p != '#')) {
          if (*local_3e0._M_dataplus._M_p == '[') {
            TrimLogConfig(&local_3e0,'[');
            TrimLogConfig(&local_3e0,']');
            std::__cxx11::string::_M_assign((string *)&local_3a0);
            local_358.first._M_dataplus._M_p = (pointer)&local_358.first.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_358,local_3e0._M_dataplus._M_p,
                       (char *)(local_3e0._M_string_length + (long)local_3e0._M_dataplus._M_p));
            sVar1 = local_358.first._M_string_length;
            _Var2._M_p = local_358.first._M_dataplus._M_p;
            if (local_358.first._M_string_length != 0) {
              sVar9 = 0;
              do {
                iVar3 = tolower((int)_Var2._M_p[sVar9]);
                _Var2._M_p[sVar9] = (char)iVar3;
                sVar9 = sVar9 + 1;
              } while (sVar1 != sVar9);
            }
            iVar3 = std::__cxx11::string::compare((char *)&local_358);
            if (iVar3 == 0) {
              std::__cxx11::string::_M_replace
                        ((ulong)&local_3a0,0,(char *)local_3a0._M_string_length,0x1327ee);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358.first._M_dataplus._M_p != &local_358.first.field_2) {
              operator_delete(local_358.first._M_dataplus._M_p,
                              local_358.first.field_2._M_allocated_capacity + 1);
            }
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                    ::find(&outInfo->_M_t,&local_3a0);
            if (iVar5._M_node == local_360) {
              LoggerInfo::LoggerInfo(&local_2b0);
              std::__cxx11::string::_M_replace
                        ((ulong)&local_2b0._path,0,(char *)local_2b0._path._M_string_length,0x1327f3
                        );
              local_2b0._level = 0;
              local_2b0._display = true;
              local_2b0._monthdir = false;
              local_2b0._enable = false;
              local_2b0._limitsize = 100;
              std::__cxx11::string::_M_assign((string *)&local_2b0);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_zsummer::log4z::LoggerInfo_&,_true>
                        (&local_358,&local_2b0._name,&local_2b0);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,zsummer::log4z::LoggerInfo>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>>
                          *)outInfo,&local_358);
              if ((FILE *)local_358.second._handle.m_file != (FILE *)0x0) {
                fclose((FILE *)local_358.second._handle.m_file);
                local_358.second._handle.m_file = (FILE *)0x0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358.second._path._M_dataplus._M_p != &local_358.second._path.field_2) {
                operator_delete(local_358.second._path._M_dataplus._M_p,
                                local_358.second._path.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358.second._pid._M_dataplus._M_p != &local_358.second._pid.field_2) {
                operator_delete(local_358.second._pid._M_dataplus._M_p,
                                local_358.second._pid.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358.second._name._M_dataplus._M_p != &local_358.second._name.field_2) {
                operator_delete(local_358.second._name._M_dataplus._M_p,
                                local_358.second._name.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358.first._M_dataplus._M_p != &local_358.first.field_2) {
                operator_delete(local_358.first._M_dataplus._M_p,
                                local_358.first.field_2._M_allocated_capacity + 1);
              }
              if ((FILE *)local_2b0._handle.m_file != (FILE *)0x0) {
                fclose((FILE *)local_2b0._handle.m_file);
                local_2b0._handle.m_file = (FILE *)0x0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._path._M_dataplus._M_p != &local_2b0._path.field_2) {
                operator_delete(local_2b0._path._M_dataplus._M_p,
                                local_2b0._path.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._pid._M_dataplus._M_p != &local_2b0._pid.field_2) {
                operator_delete(local_2b0._pid._M_dataplus._M_p,
                                local_2b0._pid.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._name._M_dataplus._M_p != &local_2b0._name.field_2) {
                operator_delete(local_2b0._name._M_dataplus._M_p,
                                local_2b0._name.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"log4z configure warning: dumplicate logger name:[",
                         0x31);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,local_3a0._M_dataplus._M_p,
                                  local_3a0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] at line:",10);
              plVar7 = (long *)std::ostream::operator<<(poVar6,iVar10);
              std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
              std::ostream::put((char)plVar7);
              std::ostream::flush();
            }
          }
          else {
            lVar8 = std::__cxx11::string::find((char)&local_3e0,0x3d);
            if (lVar8 == -1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"log4z configure warning: unresolved line:[",0x2a);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,local_3e0._M_dataplus._M_p,
                                  local_3e0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] at line:",10);
              plVar7 = (long *)std::ostream::operator<<(poVar6,iVar10);
              std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
              std::ostream::put((char)plVar7);
              std::ostream::flush();
            }
            else {
              std::__cxx11::string::substr((ulong)&local_358,(ulong)&local_3e0);
              std::__cxx11::string::operator=((string *)&local_380,(string *)&local_358);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358.first._M_dataplus._M_p != &local_358.first.field_2) {
                operator_delete(local_358.first._M_dataplus._M_p,
                                local_358.first.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::substr((ulong)&local_358,(ulong)&local_3e0);
              std::__cxx11::string::operator=((string *)&local_3c0,(string *)&local_358);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358.first._M_dataplus._M_p != &local_358.first.field_2) {
                operator_delete(local_358.first._M_dataplus._M_p,
                                local_358.first.field_2._M_allocated_capacity + 1);
              }
              TrimLogConfig(&local_380,'\0');
              TrimLogConfig(&local_3c0,'\0');
              iVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                      ::find(&outInfo->_M_t,&local_3a0);
              sVar1 = local_380._M_string_length;
              _Var2._M_p = local_380._M_dataplus._M_p;
              if (iVar5._M_node == local_360) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "log4z configure warning: not found current logger name:[",0x38);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,local_3a0._M_dataplus._M_p,
                                    local_3a0._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] at line:",10);
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,", key=",6);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar6,local_380._M_dataplus._M_p,local_380._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,", value=",8);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar6,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                std::ostream::put((char)poVar6);
                std::ostream::flush();
              }
              else {
                if (local_380._M_string_length != 0) {
                  sVar9 = 0;
                  do {
                    iVar3 = tolower((int)_Var2._M_p[sVar9]);
                    _Var2._M_p[sVar9] = (char)iVar3;
                    sVar9 = sVar9 + 1;
                  } while (sVar1 != sVar9);
                }
                iVar3 = std::__cxx11::string::compare((char *)&local_380);
                sVar1 = local_3c0._M_string_length;
                _Var2._M_p = local_3c0._M_dataplus._M_p;
                if (iVar3 == 0) {
                  std::__cxx11::string::_M_assign((string *)(iVar5._M_node + 4));
                }
                else {
                  if (local_3c0._M_string_length != 0) {
                    sVar9 = 0;
                    do {
                      iVar3 = tolower((int)_Var2._M_p[sVar9]);
                      _Var2._M_p[sVar9] = (char)iVar3;
                      sVar9 = sVar9 + 1;
                    } while (sVar1 != sVar9);
                  }
                  iVar3 = std::__cxx11::string::compare((char *)&local_380);
                  if (iVar3 == 0) {
                    iVar3 = std::__cxx11::string::compare((char *)&local_3c0);
                    if ((iVar3 == 0) ||
                       (iVar3 = std::__cxx11::string::compare((char *)&local_3c0), iVar3 == 0)) {
                      iVar5._M_node[5]._M_color = _S_red;
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)&local_3c0);
                      if (iVar3 == 0) {
                        iVar5._M_node[5]._M_color = _S_black;
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)&local_3c0);
                        if ((iVar3 == 0) ||
                           (iVar3 = std::__cxx11::string::compare((char *)&local_3c0), iVar3 == 0))
                        {
LAB_0011e4fa:
                          iVar5._M_node[5]._M_color = 2;
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare((char *)&local_3c0);
                          if (iVar3 == 0) {
                            iVar5._M_node[5]._M_color = 3;
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare((char *)&local_3c0);
                            if (iVar3 == 0) goto LAB_0011e4fa;
                            iVar3 = std::__cxx11::string::compare((char *)&local_3c0);
                            if (iVar3 == 0) {
                              iVar5._M_node[5]._M_color = 5;
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)&local_380);
                    if (iVar3 == 0) {
                      iVar3 = std::__cxx11::string::compare((char *)&local_3c0);
                      if ((iVar3 == 0) ||
                         (iVar3 = std::__cxx11::string::compare((char *)&local_3c0), iVar3 == 0)) {
                        iVar5._M_node[5].field_0x4 = 0;
                      }
                      else {
                        iVar5._M_node[5].field_0x4 = 1;
                      }
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)&local_380);
                      if (iVar3 == 0) {
                        iVar3 = std::__cxx11::string::compare((char *)&local_3c0);
                        if ((iVar3 == 0) ||
                           (iVar3 = std::__cxx11::string::compare((char *)&local_3c0), iVar3 == 0))
                        {
                          iVar5._M_node[5].field_0x5 = 0;
                        }
                        else {
                          iVar5._M_node[5].field_0x5 = 1;
                        }
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)&local_380);
                        if (iVar3 == 0) {
                          iVar3 = atoi(local_3c0._M_dataplus._M_p);
                          *(int *)&iVar5._M_node[5]._M_parent = iVar3;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        memset(local_228,0,500);
        pcVar4 = fgets(local_228,499,__stream);
      } while (pcVar4 != (char *)0x0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,
                      CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                               local_3c0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,
                      CONCAT71(local_380.field_2._M_allocated_capacity._1_7_,
                               local_380.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,
                      CONCAT71(local_3e0.field_2._M_allocated_capacity._1_7_,
                               local_3e0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,
                      CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,
                               local_3a0.field_2._M_local_buf[0]) + 1);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

static void ParseConfig(const char* file, std::map<std::string, LoggerInfo> & outInfo)
{
	//! read file content
	{
		CLog4zFile f;
		f.Open(file, "r");

		if (f.IsOpen())
		{
			std::string curLoggerName;
			int curLineNum = 0;
			char buf[500];
			std::string line;
			std::string key;
			std::string value;
			do
			{
				memset(buf, 0, 500);
				if (!f.ReadLine(buf, 500-1))
				{
					break;
				}
				line = buf;
				curLineNum++;
				TrimLogConfig(line);

				if (line.empty())
				{
					continue;
				}
				if (*(line.begin()) == '#')
				{
					continue;
				}
				if (*(line.begin()) == '[')
				{
					TrimLogConfig(line, '[');
					TrimLogConfig(line, ']');
					curLoggerName = line;
					{
						std::string tmpstr = line;
						std::transform(tmpstr.begin(), tmpstr.end(), tmpstr.begin(), ::tolower);
						if (tmpstr == "main")
						{
							curLoggerName = "Main";
						}
					}
					std::map<std::string, LoggerInfo>::iterator iter = outInfo.find(curLoggerName);
					if (iter == outInfo.end())
					{
						LoggerInfo li;
						li.SetDefaultInfo();
						li._name = curLoggerName;
						outInfo.insert(std::make_pair(li._name, li));
					}
					else
					{
						std::cout << "log4z configure warning: dumplicate logger name:["<< curLoggerName << "] at line:" << curLineNum << std::endl;
					}
					continue;
				}
				size_t pos = line.find_first_of('=');
				if (pos == std::string::npos)
				{
					std::cout << "log4z configure warning: unresolved line:["<< line << "] at line:" << curLineNum << std::endl;
					continue;
				}
				key = line.substr(0, pos);
				value = line.substr(pos+1);
				TrimLogConfig(key);
				TrimLogConfig(value);
				std::map<std::string, LoggerInfo>::iterator iter = outInfo.find(curLoggerName);
				if (iter == outInfo.end())
				{
					std::cout << "log4z configure warning: not found current logger name:["<< curLoggerName << "] at line:" << curLineNum
						<< ", key=" <<key << ", value=" << value << std::endl;
					continue;
				}
				std::transform(key.begin(), key.end(), key.begin(), ::tolower);
				//! path
				if (key == "path")
				{
					iter->second._path = value;
					continue;
				}
				std::transform(value.begin(), value.end(), value.begin(), ::tolower);
				//! level
				if (key == "level")
				{
					if (value == "debug" || value == "all")
					{
						iter->second._level = LOG_LEVEL_DEBUG;
					}
					else if (value == "info")
					{
						iter->second._level = LOG_LEVEL_INFO;
					}
					else if (value == "warn" || value == "warning")
					{
						iter->second._level = LOG_LEVEL_WARN;
					}
					else if (value == "error")
					{
						iter->second._level = LOG_LEVEL_ERROR;
					}
					else if (value == "alarm")
					{
						iter->second._level = LOG_LEVEL_WARN;
					}
					else if (value == "fatal")
					{
						iter->second._level = LOG_LEVEL_FATAL;
					}
				}
				//! display
				else if (key == "display")
				{
					if (value == "false" || value == "0")
					{
						iter->second._display = false;
					}
					else
					{
						iter->second._display = true;
					}
				}
				//! monthdir
				else if (key == "monthdir")
				{
					if (value == "false" || value == "0")
					{
						iter->second._monthdir = false;
					}
					else
					{
						iter->second._monthdir = true;
					}
				}
				//! limit file size
				else if (key == "limitsize")
				{
					iter->second._limitsize = atoi(value.c_str());
				}

			} while (1);
		}
	}
}